

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# priolist.c
# Opt level: O2

void nn_priolist_advance(nn_priolist *self,int release)

{
  uint uVar1;
  int iVar2;
  nn_list_item *pnVar3;
  nn_list_item *pnVar4;
  nn_list *self_00;
  
  if (self->current < 1) {
    nn_backtrace_print();
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","self->current > 0",
            "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/protocols/utils/priolist.c"
            ,0x9a);
    fflush(_stderr);
    nn_err_abort();
  }
  uVar1 = self->current - 1;
  self_00 = &self->slots[uVar1].pipes;
  pnVar3 = &(self->slots[uVar1].current)->item;
  if (release == 0) {
    pnVar3 = nn_list_next(self_00,pnVar3);
  }
  else {
    pnVar3 = nn_list_erase(self_00,pnVar3);
  }
  if (pnVar3 == (nn_list_item *)0x0) {
    pnVar3 = nn_list_begin(self_00);
  }
  pnVar4 = pnVar3 + -1;
  if (pnVar3 == (nn_list_item *)0x0) {
    pnVar4 = (nn_list_item *)0x0;
  }
  self_00[1].first = pnVar4;
  while( true ) {
    iVar2 = nn_list_empty(self_00);
    if (iVar2 == 0) {
      return;
    }
    iVar2 = self->current;
    self->current = iVar2 + 1;
    if (0xf < (long)iVar2) break;
    self_00 = &self->slots[iVar2].pipes;
  }
  self->current = -1;
  return;
}

Assistant:

void nn_priolist_advance (struct nn_priolist *self, int release)
{
    struct nn_priolist_slot *slot;
    struct nn_list_item *it;

    nn_assert (self->current > 0);
    slot = &self->slots [self->current - 1];

    /*  Move slot's current pointer to the next pipe. */
    if (release)
        it = nn_list_erase (&slot->pipes, &slot->current->item);
    else
        it = nn_list_next (&slot->pipes, &slot->current->item);
    if (!it)
        it = nn_list_begin (&slot->pipes);
    slot->current = nn_cont (it, struct nn_priolist_data, item);

    /* If there are no more pipes in this slot, find a non-empty slot with
       lower priority. */
    while (nn_list_empty (&slot->pipes)) {
        ++self->current;
        if (self->current > NN_PRIOLIST_SLOTS) {
            self->current = -1;
            return;
        }
        slot = &self->slots [self->current - 1];
    }
}